

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_aggsig_export_secnonce_single(secp256k1_context *ctx,uchar *secnonce32,uchar *seed)

{
  int iVar1;
  uchar *in_RSI;
  long in_RDI;
  secp256k1_rfc6979_hmac_sha256 rng;
  secp256k1_gej pubnonce;
  secp256k1_scalar secnonce;
  char *in_stack_fffffffffffffef8;
  secp256k1_callback *in_stack_ffffffffffffff00;
  secp256k1_rfc6979_hmac_sha256 *in_stack_ffffffffffffff20;
  secp256k1_gej *in_stack_ffffffffffffff28;
  secp256k1_scalar *in_stack_ffffffffffffff30;
  secp256k1_context *in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffffc0;
  uchar *in_stack_ffffffffffffffc8;
  secp256k1_rfc6979_hmac_sha256 *in_stack_ffffffffffffffd0;
  int local_4;
  
  iVar1 = secp256k1_ecmult_gen_context_is_built((secp256k1_ecmult_gen_context *)(in_RDI + 8));
  if (iVar1 == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    local_4 = 0;
  }
  else if (in_RSI == (uchar *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    local_4 = 0;
  }
  else {
    secp256k1_rfc6979_hmac_sha256_initialize
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    iVar1 = secp256k1_aggsig_generate_nonce_single
                      (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28
                       ,in_stack_ffffffffffffff20);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      secp256k1_scalar_get_b32(in_RSI,(secp256k1_scalar *)&stack0xffffffffffffffc0);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_aggsig_export_secnonce_single(const secp256k1_context* ctx, unsigned char* secnonce32, const unsigned char* seed) {
    secp256k1_scalar secnonce;
    secp256k1_gej pubnonce;
    secp256k1_rfc6979_hmac_sha256 rng;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(secnonce32 != NULL);
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, seed, 32);

    if (secp256k1_aggsig_generate_nonce_single(ctx, &secnonce, &pubnonce, &rng) == 0){
       return 0;
    }

    secp256k1_scalar_get_b32(secnonce32, &secnonce);
    return 1;
}